

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsequ.c
# Opt level: O3

void zgsequ(SuperMatrix *A,double *r,double *c,double *rowcnd,double *colcnd,double *amax,int *info)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  doublecomplex *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int ii;
  int local_34;
  
  *info = 0;
  if ((((A->nrow < 0) || (A->ncol < 0)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_Z || (A->Mtype != SLU_GE)))) {
    *info = -1;
    local_34 = 1;
    input_error("zgsequ",&local_34);
    return;
  }
  if (A->nrow == 0 || A->ncol == 0) {
    *rowcnd = 1.0;
    *colcnd = 1.0;
    *amax = 0.0;
    return;
  }
  pvVar1 = A->Store;
  lVar2 = *(long *)((long)pvVar1 + 8);
  dVar13 = dmach("S");
  uVar11 = A->nrow;
  if (0 < (long)(int)uVar11) {
    memset(r,0,(long)(int)uVar11 * 8);
  }
  uVar9 = A->ncol;
  if (0 < (int)uVar9) {
    lVar5 = *(long *)((long)pvVar1 + 0x18);
    lVar7 = 0;
    do {
      iVar3 = *(int *)(lVar5 + lVar7 * 4);
      lVar8 = (long)iVar3;
      lVar10 = lVar7 + 1;
      if (iVar3 < *(int *)(lVar5 + 4 + lVar7 * 4)) {
        pdVar12 = (doublecomplex *)(lVar8 * 0x10 + lVar2);
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar8 * 4);
          dVar15 = r[iVar3];
          dVar14 = z_abs1(pdVar12);
          if (dVar15 <= dVar14) {
            dVar15 = z_abs1(pdVar12);
          }
          else {
            dVar15 = r[iVar3];
          }
          r[iVar3] = dVar15;
          lVar8 = lVar8 + 1;
          lVar5 = *(long *)((long)pvVar1 + 0x18);
          pdVar12 = pdVar12 + 1;
        } while (lVar8 < *(int *)(lVar5 + lVar10 * 4));
        uVar9 = A->ncol;
      }
      lVar7 = lVar10;
    } while (lVar10 < (int)uVar9);
    uVar11 = A->nrow;
  }
  dVar14 = 1.0 / dVar13;
  dVar15 = dVar14;
  if ((int)uVar11 < 1) {
    *amax = 0.0;
    dVar17 = 0.0;
    if ((dVar14 == 0.0) && (!NAN(dVar14))) goto LAB_00110336;
  }
  else {
    uVar4 = (ulong)uVar11;
    dVar17 = 0.0;
    uVar6 = 0;
    do {
      dVar16 = r[uVar6];
      if (dVar17 <= dVar16) {
        dVar17 = dVar16;
      }
      if (dVar16 <= dVar15) {
        dVar15 = dVar16;
      }
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    *amax = dVar17;
    if ((dVar15 == 0.0) && (!NAN(dVar15))) {
      if (0 < (int)uVar11) {
        uVar6 = 0;
        do {
          if ((r[uVar6] == 0.0) && (!NAN(r[uVar6]))) {
            *info = (int)uVar6 + 1;
            return;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      goto LAB_00110336;
    }
    if (0 < (int)uVar11) {
      uVar6 = 0;
      do {
        dVar16 = r[uVar6];
        if (r[uVar6] <= dVar13) {
          dVar16 = dVar13;
        }
        if (dVar14 <= dVar16) {
          dVar16 = dVar14;
        }
        r[uVar6] = 1.0 / dVar16;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  if (dVar15 <= dVar13) {
    dVar15 = dVar13;
  }
  if (dVar14 <= dVar17) {
    dVar17 = dVar14;
  }
  *rowcnd = dVar15 / dVar17;
LAB_00110336:
  dVar15 = dVar14;
  if ((int)uVar9 < 1) {
    dVar17 = 0.0;
    if ((dVar14 == 0.0) && (!NAN(dVar14))) {
      return;
    }
  }
  else {
    memset(c,0,(ulong)uVar9 << 3);
    uVar4 = (ulong)uVar9;
    lVar5 = *(long *)((long)pvVar1 + 0x18);
    lVar7 = 0;
    do {
      iVar3 = *(int *)(lVar5 + lVar7 * 4);
      lVar10 = (long)iVar3;
      lVar8 = lVar7 + 1;
      if (iVar3 < *(int *)(lVar5 + 4 + lVar7 * 4)) {
        dVar17 = c[lVar7];
        pdVar12 = (doublecomplex *)(lVar10 * 0x10 + lVar2);
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar10 * 4);
          dVar16 = z_abs1(pdVar12);
          if (dVar17 <= dVar16 * r[iVar3]) {
            dVar17 = z_abs1(pdVar12);
            dVar17 = dVar17 * r[iVar3];
          }
          else {
            dVar17 = c[lVar7];
          }
          c[lVar7] = dVar17;
          lVar10 = lVar10 + 1;
          lVar5 = *(long *)((long)pvVar1 + 0x18);
          pdVar12 = pdVar12 + 1;
        } while (lVar10 < *(int *)(lVar5 + lVar8 * 4));
        uVar4 = (ulong)(uint)A->ncol;
      }
      iVar3 = (int)uVar4;
      lVar7 = lVar8;
    } while (lVar8 < iVar3);
    dVar17 = 0.0;
    if (0 < iVar3) {
      uVar6 = 0;
      do {
        dVar16 = c[uVar6];
        if (dVar17 <= dVar16) {
          dVar17 = dVar16;
        }
        if (dVar16 <= dVar15) {
          dVar15 = dVar16;
        }
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    if ((dVar15 == 0.0) && (!NAN(dVar15))) {
      if (iVar3 < 1) {
        return;
      }
      iVar3 = -1;
      uVar6 = 0;
      while ((c[uVar6] != 0.0 || (NAN(c[uVar6])))) {
        uVar6 = uVar6 + 1;
        iVar3 = iVar3 + -1;
        if (uVar4 == uVar6) {
          return;
        }
      }
      *info = A->nrow - iVar3;
      return;
    }
    if (0 < iVar3) {
      uVar6 = 0;
      do {
        dVar16 = c[uVar6];
        if (c[uVar6] <= dVar13) {
          dVar16 = dVar13;
        }
        if (dVar14 <= dVar16) {
          dVar16 = dVar14;
        }
        c[uVar6] = 1.0 / dVar16;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  if (dVar15 <= dVar13) {
    dVar15 = dVar13;
  }
  if (dVar14 <= dVar17) {
    dVar17 = dVar14;
  }
  *colcnd = dVar15 / dVar17;
  return;
}

Assistant:

void
zgsequ(SuperMatrix *A, double *r, double *c, double *rowcnd,
	double *colcnd, double *amax, int *info)
{


    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int_t i, j;
    int   irow;
    double rcmin, rcmax;
    double bignum, smlnum;
    extern double dmach(char *);
    
    /* Test the input parameters. */
    *info = 0;
    if ( A->nrow < 0 || A->ncol < 0 ||
	 A->Stype != SLU_NC || A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -1;
    if (*info != 0) {
	int ii = -(*info);
	input_error("zgsequ", &ii);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || A->ncol == 0 ) {
	*rowcnd = 1.;
	*colcnd = 1.;
	*amax = 0.;
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Get machine constants. */
    smlnum = dmach("S");  /* slamch_("S"); */
    bignum = 1. / smlnum;

    /* Compute row scale factors. */
    for (i = 0; i < A->nrow; ++i) r[i] = 0.;

    /* Find the maximum element in each row. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    r[irow] = SUPERLU_MAX( r[irow], z_abs1(&Aval[i]) );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (i = 0; i < A->nrow; ++i) {
	rcmax = SUPERLU_MAX(rcmax, r[i]);
	rcmin = SUPERLU_MIN(rcmin, r[i]);
    }
    *amax = rcmax;

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (i = 0; i < A->nrow; ++i)
	    if (r[i] == 0.) {
		*info = i + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (i = 0; i < A->nrow; ++i)
	    r[i] = 1. / SUPERLU_MIN( SUPERLU_MAX( r[i], smlnum ), bignum );
	/* Compute ROWCND = min(R(I)) / max(R(I)) */
	*rowcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    /* Compute column scale factors */
    for (j = 0; j < A->ncol; ++j) c[j] = 0.;

    /* Find the maximum element in each column, assuming the row
       scalings computed above. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    c[j] = SUPERLU_MAX( c[j], z_abs1(&Aval[i]) * r[irow] );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (j = 0; j < A->ncol; ++j) {
	rcmax = SUPERLU_MAX(rcmax, c[j]);
	rcmin = SUPERLU_MIN(rcmin, c[j]);
    }

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (j = 0; j < A->ncol; ++j)
	    if ( c[j] == 0. ) {
		*info = A->nrow + j + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (j = 0; j < A->ncol; ++j)
	    c[j] = 1. / SUPERLU_MIN( SUPERLU_MAX( c[j], smlnum ), bignum);
	/* Compute COLCND = min(C(J)) / max(C(J)) */
	*colcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    return;

}